

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.cpp
# Opt level: O0

U32 duckdb_zstd::HUF_buildDEltX2U32(U32 symbol,U32 nbBits,U32 baseSeq,int level)

{
  uint uVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  U32 seq;
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 local_4;
  
  uVar1 = MEM_isLittleEndian();
  if (uVar1 == 0) {
    if (in_ECX == 1) {
      local_20 = in_EDI << 8;
    }
    else {
      local_20 = in_EDX * 0x100 + in_EDI;
    }
    local_4 = local_20 * 0x10000 + in_ESI * 0x100 + in_ECX;
  }
  else {
    local_1c = in_EDI;
    if (in_ECX != 1) {
      local_1c = in_EDX + in_EDI * 0x100;
    }
    local_4 = local_1c + in_ESI * 0x10000 + in_ECX * 0x1000000;
  }
  return local_4;
}

Assistant:

static U32 HUF_buildDEltX2U32(U32 symbol, U32 nbBits, U32 baseSeq, int level)
{
    U32 seq;
    DEBUG_STATIC_ASSERT(offsetof(HUF_DEltX2, sequence) == 0);
    DEBUG_STATIC_ASSERT(offsetof(HUF_DEltX2, nbBits) == 2);
    DEBUG_STATIC_ASSERT(offsetof(HUF_DEltX2, length) == 3);
    DEBUG_STATIC_ASSERT(sizeof(HUF_DEltX2) == sizeof(U32));
    if (MEM_isLittleEndian()) {
        seq = level == 1 ? symbol : (baseSeq + (symbol << 8));
        return seq + (nbBits << 16) + ((U32)level << 24);
    } else {
        seq = level == 1 ? (symbol << 8) : ((baseSeq << 8) + symbol);
        return (seq << 16) + (nbBits << 8) + (U32)level;
    }
}